

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O1

bool board::makemove::move(Move *move,Board *pos)

{
  pointer *ppUVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  iterator __position;
  bool bVar5;
  bool bVar6;
  ulong uVar7;
  int (*paiVar8) [10];
  int iVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  Undo current;
  Undo local_58;
  Move *local_40;
  long local_38;
  ulong uVar17;
  
  uVar2 = move->value;
  uVar15 = uVar2 & 0x7f;
  uVar16 = uVar2 >> 7 & 0x7f;
  uVar17 = (ulong)uVar16;
  iVar3 = pos->side;
  local_58.fiftyMove = pos->fiftyMove;
  local_38 = (long)pos->board[uVar15];
  local_58.castlePerm = pos->castlePerm;
  local_58.enPas = pos->enPas;
  local_58.hashKey = pos->hashKey;
  local_58.moveValue = uVar2;
  local_40 = move;
  if ((uVar2 >> 0x12 & 1) == 0) {
    if ((uVar2 >> 0x18 & 1) != 0) {
      if (uVar16 < 0x5d) {
        if (uVar16 == 0x17) {
          iVar9 = pos->board[0x15];
          iVar4 = Board::PIECE_COLOR[iVar9];
          uVar7 = local_58.hashKey ^ Board::PIECE_KEYS[iVar9][0x18];
          pos->hashKey = uVar7;
          pos->hashKey = uVar7 ^ Board::PIECE_KEYS[iVar9][0x15];
          pos->board[0x15] = 0;
          pos->board[0x18] = iVar9;
          if (Board::PIECE_NO_TEAM[iVar9] == 1) {
            bitboard::clearBit(pos->pawns + iVar4,0);
            bitboard::clearBit(pos->pawns + 2,0);
            bitboard::setBit(pos->pawns + iVar4,3);
            bitboard::setBit(pos->pawns + 2,3);
          }
          if (0 < (long)pos->pNum[iVar9]) {
            lVar11 = 0;
            do {
              if (pos->pList[iVar9][lVar11] == 0x15) {
                pos->pList[iVar9][lVar11] = 0x18;
                break;
              }
              lVar11 = lVar11 + 1;
            } while (pos->pNum[iVar9] != lVar11);
          }
        }
        else if (uVar16 == 0x1b) {
          iVar9 = pos->board[0x1c];
          iVar4 = Board::PIECE_COLOR[iVar9];
          uVar7 = local_58.hashKey ^ Board::PIECE_KEYS[iVar9][0x1a];
          pos->hashKey = uVar7;
          pos->hashKey = uVar7 ^ Board::PIECE_KEYS[iVar9][0x1c];
          pos->board[0x1c] = 0;
          pos->board[0x1a] = iVar9;
          if (Board::PIECE_NO_TEAM[iVar9] == 1) {
            bitboard::clearBit(pos->pawns + iVar4,7);
            bitboard::clearBit(pos->pawns + 2,7);
            bitboard::setBit(pos->pawns + iVar4,5);
            bitboard::setBit(pos->pawns + 2,5);
          }
          if (0 < (long)pos->pNum[iVar9]) {
            lVar11 = 0;
            do {
              if (pos->pList[iVar9][lVar11] == 0x1c) {
                pos->pList[iVar9][lVar11] = 0x1a;
                break;
              }
              lVar11 = lVar11 + 1;
            } while (pos->pNum[iVar9] != lVar11);
          }
        }
      }
      else if (uVar16 == 0x5d) {
        iVar9 = pos->board[0x5b];
        iVar4 = Board::PIECE_COLOR[iVar9];
        uVar7 = local_58.hashKey ^ Board::PIECE_KEYS[iVar9][0x5e];
        pos->hashKey = uVar7;
        pos->hashKey = uVar7 ^ Board::PIECE_KEYS[iVar9][0x5b];
        pos->board[0x5b] = 0;
        pos->board[0x5e] = iVar9;
        if (Board::PIECE_NO_TEAM[iVar9] == 1) {
          bitboard::clearBit(pos->pawns + iVar4,0x38);
          bitboard::clearBit(pos->pawns + 2,0x38);
          bitboard::setBit(pos->pawns + iVar4,0x3b);
          bitboard::setBit(pos->pawns + 2,0x3b);
        }
        if (0 < (long)pos->pNum[iVar9]) {
          lVar11 = 0;
          do {
            if (pos->pList[iVar9][lVar11] == 0x5b) {
              pos->pList[iVar9][lVar11] = 0x5e;
              break;
            }
            lVar11 = lVar11 + 1;
          } while (pos->pNum[iVar9] != lVar11);
        }
      }
      else if (uVar16 == 0x61) {
        iVar9 = pos->board[0x62];
        iVar4 = Board::PIECE_COLOR[iVar9];
        uVar7 = local_58.hashKey ^ Board::PIECE_KEYS[iVar9][0x60];
        pos->hashKey = uVar7;
        pos->hashKey = uVar7 ^ Board::PIECE_KEYS[iVar9][0x62];
        pos->board[0x62] = 0;
        pos->board[0x60] = iVar9;
        if (Board::PIECE_NO_TEAM[iVar9] == 1) {
          bitboard::clearBit(pos->pawns + iVar4,0x3f);
          bitboard::clearBit(pos->pawns + 2,0x3f);
          bitboard::setBit(pos->pawns + iVar4,0x3d);
          bitboard::setBit(pos->pawns + 2,0x3d);
        }
        if (0 < (long)pos->pNum[iVar9]) {
          lVar11 = 0;
          do {
            if (pos->pList[iVar9][lVar11] == 0x62) {
              pos->pList[iVar9][lVar11] = 0x60;
              break;
            }
            lVar11 = lVar11 + 1;
          } while (pos->pNum[iVar9] != lVar11);
        }
      }
    }
  }
  else {
    if (iVar3 == 0) {
      lVar11 = (long)pos->board[uVar17 - 10];
      iVar9 = Board::PIECE_COLOR[lVar11];
      pos->material[iVar9] = pos->material[iVar9] - Board::PIECE_VAL[lVar11];
      pos->hashKey = local_58.hashKey ^ (ulong)(&__dso_handle)[lVar11 * 0x78 + uVar17];
      pos->board[uVar17 - 10] = 0;
      if (Board::PIECE_NO_TEAM[lVar11] == 1) {
        iVar4 = Board::SQ64[uVar17 - 10];
        bitboard::clearBit(pos->pawns + iVar9,iVar4);
        bitboard::clearBit(pos->pawns + 2,iVar4);
      }
      paiVar8 = pos->pList + lVar11;
      lVar10 = (long)pos->pNum[lVar11];
      lVar12 = -1;
      if (0 < lVar10) {
        lVar14 = 0;
        do {
          lVar12 = lVar14;
          if ((*paiVar8)[lVar14] == (int)(uVar17 - 10)) break;
          lVar14 = lVar14 + 1;
          lVar12 = -1;
        } while (lVar10 != lVar14);
      }
    }
    else {
      uVar13 = uVar16 + 10;
      lVar11 = (long)pos->board[uVar13];
      iVar9 = Board::PIECE_COLOR[lVar11];
      pos->material[iVar9] = pos->material[iVar9] - Board::PIECE_VAL[lVar11];
      pos->hashKey = local_58.hashKey ^ Board::PIECE_KEYS[lVar11][uVar13];
      pos->board[uVar13] = 0;
      if (Board::PIECE_NO_TEAM[lVar11] == 1) {
        iVar4 = Board::SQ64[uVar17 + 10];
        bitboard::clearBit(pos->pawns + iVar9,iVar4);
        bitboard::clearBit(pos->pawns + 2,iVar4);
      }
      paiVar8 = pos->pList + lVar11;
      lVar10 = (long)pos->pNum[lVar11];
      lVar12 = -1;
      if (0 < lVar10) {
        lVar14 = 0;
        do {
          lVar12 = lVar14;
          if ((*paiVar8)[lVar14] == uVar13) break;
          lVar14 = lVar14 + 1;
          lVar12 = -1;
        } while (lVar10 != lVar14);
      }
    }
    pos->pNum[lVar11] = (int)lVar10 + -1;
    (*paiVar8)[lVar12] = *(int *)((long)(paiVar8 + -1) + (lVar10 + 9) * 4);
  }
  if ((long)pos->enPas != 99) {
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][pos->enPas];
  }
  pos->hashKey = pos->hashKey ^ Board::CASTLE_KEYS[pos->castlePerm];
  __position._M_current =
       (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<board::Undo,std::allocator<board::Undo>>::_M_realloc_insert<board::Undo_const&>
              ((vector<board::Undo,std::allocator<board::Undo>> *)&pos->history,__position,&local_58
              );
  }
  else {
    (__position._M_current)->hashKey = local_58.hashKey;
    (__position._M_current)->castlePerm = local_58.castlePerm;
    (__position._M_current)->enPas = local_58.enPas;
    (__position._M_current)->fiftyMove = local_58.fiftyMove;
    (__position._M_current)->moveValue = local_58.moveValue;
    ppUVar1 = &(pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppUVar1 = *ppUVar1 + 1;
  }
  uVar13 = pos->castlePerm & Board::CASTLE_PERM_MASK[uVar15] & Board::CASTLE_PERM_MASK[uVar17];
  pos->castlePerm = uVar13;
  uVar7 = pos->hashKey ^ Board::CASTLE_KEYS[(int)uVar13];
  pos->hashKey = uVar7;
  pos->enPas = 99;
  pos->fiftyMove = pos->fiftyMove + 1;
  if ((uVar2 & 0x3c000) != 0) {
    lVar11 = (long)pos->board[uVar17];
    iVar9 = Board::PIECE_COLOR[lVar11];
    pos->material[iVar9] = pos->material[iVar9] - Board::PIECE_VAL[lVar11];
    pos->hashKey = uVar7 ^ Board::PIECE_KEYS[lVar11][uVar17];
    pos->board[uVar17] = 0;
    if (Board::PIECE_NO_TEAM[lVar11] == 1) {
      iVar4 = Board::SQ64[uVar17];
      bitboard::clearBit(pos->pawns + iVar9,iVar4);
      bitboard::clearBit(pos->pawns + 2,iVar4);
    }
    lVar10 = (long)pos->pNum[lVar11];
    lVar12 = -1;
    if (0 < lVar10) {
      lVar14 = 0;
      do {
        lVar12 = lVar14;
        if (pos->pList[lVar11][lVar14] == uVar16) break;
        lVar14 = lVar14 + 1;
        lVar12 = -1;
      } while (lVar10 != lVar14);
    }
    pos->pNum[lVar11] = pos->pNum[lVar11] + -1;
    pos->pList[lVar11][lVar12] = pos->pList[lVar11 + -1][lVar10 + 9];
    pos->fiftyMove = 0;
  }
  pos->ply = pos->ply + 1;
  if ((Board::PIECE_NO_TEAM[local_38] == 1) &&
     (pos->fiftyMove = 0, (local_40->value & 0x80000) != 0)) {
    iVar9 = uVar15 + 10;
    if (iVar3 != 0) {
      iVar9 = uVar15 - 10;
    }
    pos->enPas = iVar9;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][iVar9];
  }
  iVar3 = pos->board[uVar15];
  iVar9 = Board::PIECE_COLOR[iVar3];
  uVar7 = pos->hashKey ^ Board::PIECE_KEYS[iVar3][uVar17];
  pos->hashKey = uVar7;
  pos->hashKey = uVar7 ^ Board::PIECE_KEYS[iVar3][uVar15];
  pos->board[uVar15] = 0;
  pos->board[uVar17] = iVar3;
  if (Board::PIECE_NO_TEAM[iVar3] == 1) {
    iVar4 = Board::SQ64[uVar15];
    bitboard::clearBit(pos->pawns + iVar9,iVar4);
    bitboard::clearBit(pos->pawns + 2,iVar4);
    iVar4 = Board::SQ64[uVar17];
    bitboard::setBit(pos->pawns + iVar9,iVar4);
    bitboard::setBit(pos->pawns + 2,iVar4);
  }
  uVar13 = uVar2 >> 0x14 & 0xf;
  if (0 < (long)pos->pNum[iVar3]) {
    lVar11 = 0;
    do {
      if (pos->pList[iVar3][lVar11] == uVar15) {
        pos->pList[iVar3][lVar11] = uVar16;
        break;
      }
      lVar11 = lVar11 + 1;
    } while (pos->pNum[iVar3] != lVar11);
  }
  if ((uVar2 >> 0x14 & 0xf) != 0) {
    lVar11 = (long)pos->board[uVar17];
    iVar3 = Board::PIECE_COLOR[lVar11];
    pos->material[iVar3] = pos->material[iVar3] - Board::PIECE_VAL[lVar11];
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar11][uVar17];
    pos->board[uVar17] = 0;
    if (Board::PIECE_NO_TEAM[lVar11] == 1) {
      iVar9 = Board::SQ64[uVar17];
      bitboard::clearBit(pos->pawns + iVar3,iVar9);
      bitboard::clearBit(pos->pawns + 2,iVar9);
    }
    lVar10 = (long)pos->pNum[lVar11];
    lVar12 = -1;
    if (0 < lVar10) {
      lVar14 = 0;
      do {
        lVar12 = lVar14;
        if (pos->pList[lVar11][lVar14] == uVar16) break;
        lVar14 = lVar14 + 1;
        lVar12 = -1;
      } while (lVar10 != lVar14);
    }
    pos->pNum[lVar11] = pos->pNum[lVar11] + -1;
    pos->pList[lVar11][lVar12] = pos->pList[lVar11 + -1][lVar10 + 9];
    uVar7 = (ulong)(uVar13 * 4);
    iVar3 = *(int *)((long)Board::PIECE_COLOR + uVar7);
    pos->material[iVar3] = pos->material[iVar3] + *(int *)((long)Board::PIECE_VAL + uVar7);
    pos->board[uVar17] = uVar13;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[uVar13][uVar17];
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar7) == 1) {
      iVar9 = Board::SQ64[uVar17];
      bitboard::setBit(pos->pawns + iVar3,iVar9);
      bitboard::setBit(pos->pawns + 2,iVar9);
    }
    pos->pList[uVar13][pos->pNum[uVar13]] = uVar16;
    pos->pNum[uVar13] = pos->pNum[uVar13] + 1;
  }
  uVar2 = pos->side;
  pos->side = uVar2 ^ 1;
  pos->hashKey = pos->hashKey ^ Board::SIDE_KEY;
  if (((uVar2 == 0) && (bVar5 = Board::sqAttacked(pos,pos->pList[6][0],1), bVar5)) ||
     ((bVar5 = true, pos->side == 0 && (bVar6 = Board::sqAttacked(pos,pos->pList[0xc][0],0), bVar6))
     )) {
    undo(pos);
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool board::makemove::move(Move& move, Board& pos)
{
    int from = Move::FROMSQ(move.getValue());
    int to = Move::TOSQ(move.getValue());
    int captured = Move::CAPTURED(move.getValue());
    int promoted = Move::PROMOTED(move.getValue());
    int side = pos.getSide();
    int piece = pos.getSquare(from);
    int castle = pos.getCastlePerm();
    int enPas = pos.getEnPas();
    int fiftyMove = pos.getFiftyMove();
    uint64_t hash = pos.getHashKey();
    Undo current = Undo(castle, enPas, fiftyMove, move.getValue(), hash);
    if (move.getValue() & Move::MFLAGEP) {
        if (side == WHITE) {
            clearPiece(to - 10, pos);
        }
        else {
            clearPiece(to + 10, pos);
        }
    }
    else if (move.getValue() & Move::MFLAGCA) {
        if (to == C1) {
            movePiece(A1, D1, pos);
        }
        else if (to == C8) {
            movePiece(A8, D8, pos);
        }
        else if (to == G1) {
            movePiece(H1, F1, pos);
        }
        else if (to == G8) {
            movePiece(H8, F8, pos);
        }
    }
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.addHistory(current);
    pos.updateCastlePerm(to, from);
    pos.hashCastle();
    pos.clearEnPas();
    pos.incrementFiftyMove();
    if (captured != EMPTY) {
        clearPiece(to, pos);
        pos.resetFiftyMove();
    }
    pos.incrementPly();
    if (Board::PIECE_NO_TEAM[piece] == WP) {
        pos.resetFiftyMove();
        if (move.getValue() & Move::MFLAGPS) {
            if (side == WHITE) {
                pos.setEnPas(from + 10);
            }
            else {
                pos.setEnPas(from - 10);
            }
            pos.hashEnPas();
        }
    }
    movePiece(from, to, pos);
    if (promoted != EMPTY) {
        clearPiece(to, pos);
        addPiece(promoted, to, pos);
    }
    pos.updateSide();
    pos.hashSide();
    if (pos.getSide() == BLACK && pos.sqAttacked(pos.getPieceList(WK)[0], BLACK)) {
        undo(pos);
        return false;
    }
    if (pos.getSide() == WHITE && pos.sqAttacked(pos.getPieceList(BK)[0], WHITE)) {
        undo(pos);
        return false;
    }
    return true;
}